

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d81.cpp
# Opt level: O0

bool WriteD81(FILE *param_1,shared_ptr<Disk> *param_2)

{
  logic_error *this;
  shared_ptr<Disk> *param_1_local;
  FILE *param_0_local;
  
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"D81 writing not implemented");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool WriteD81(FILE* /*f_*/, std::shared_ptr<Disk>&/*disk*/)
{
    throw std::logic_error("D81 writing not implemented");
#if 0
    auto missing = 0;
    bool f = true;

    PCFORMAT pf_ = &fmtD81;
    auto cyls = D81_TRACKS;
    auto heads = D81_SIDES;

    MEMORY mem(D81_TRACK_SIZE);

    for (auto cyl = 0; f && cyl < cyls; cyl++)
    {
        for (auto head = heads - 1; f && head >= 0; head--)
        {
            missing += pd_->ReadRegularTrack(cyl, head, pf_, mem);
            f = (fwrite(mem, D81_SECTOR_SIZE, pf_->sectors, f_) == pf_->sectors);
        }
    }

    if (!f)
        throw util::exception("write error");

    if (missing)
        Message(msgWarning, "source missing %d/%d sectors", missing, cyls * heads * pf_->sectors);

    return true;
#endif
}